

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_RECHARGE(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  byte *pbVar2;
  wchar_t strength;
  player_upkeep *ppVar3;
  _Bool _Var4;
  wchar_t wVar5;
  uint32_t uVar6;
  int iVar7;
  _Bool none_left;
  object *obj;
  object *local_20;
  
  strength = (context->value).base;
  context->ident = true;
  player->upkeep->recharge_pow = strength;
  if (context->cmd == (command *)0x0) {
    _Var4 = get_item(&obj,"Recharge which item? ","You have nothing to recharge.",CMD_NULL,
                     tval_can_have_charges,L'І');
    if (!_Var4) {
      return false;
    }
  }
  else {
    wVar5 = cmd_get_item((command_conflict *)context->cmd,"tgtitem",&obj,"Recharge which item? ",
                         "You have nothing to recharge.",tval_can_have_charges,L'І');
    if (wVar5 != L'\0') {
      return false;
    }
  }
  wVar5 = recharge_failure_chance(obj,strength);
  if ((wVar5 < L'\x02') || (uVar6 = Rand_div(wVar5), uVar6 == 0)) {
    none_left = false;
    msg("The recharge backfires!");
    msg("There is a bright flash of light.");
    _Var4 = object_is_carried(player,obj);
    if (_Var4) {
      local_20 = gear_object_for_use(player,obj,L'\x01',true,&none_left);
    }
    else {
      local_20 = floor_object_for_use(player,obj,L'\x01',true,&none_left);
    }
    if (local_20->known != (object *)0x0) {
      object_delete((chunk *)player->cave,(chunk *)0x0,&local_20->known);
    }
    object_delete((chunk *)cave,(chunk *)player->cave,&local_20);
  }
  else {
    iVar7 = strength / ((100 - obj->kind->level) / -10 + 10);
    if (-1 < iVar7) {
      uVar6 = Rand_div(iVar7 + 1);
      obj->pval = (short)uVar6 + obj->pval + 3;
    }
  }
  ppVar3 = player->upkeep;
  puVar1 = &ppVar3->notice;
  *puVar1 = *puVar1 | 1;
  pbVar2 = (byte *)((long)&ppVar3->redraw + 2);
  *pbVar2 = *pbVar2 | 2;
  return true;
}

Assistant:

bool effect_handler_RECHARGE(effect_handler_context_t *context)
{
	int i, t;
	int strength = context->value.base;
	int itemmode = (USE_INVEN | USE_FLOOR | SHOW_RECHARGE);
	struct object *obj;
	bool used = false;
	const char *q, *s;

	/* Immediately obvious */
	context->ident = true;

	/* Used to show recharge failure rates */
	player->upkeep->recharge_pow = strength;

	/* Get an item */
	q = "Recharge which item? ";
	s = "You have nothing to recharge.";
	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, q, s,
				tval_can_have_charges, itemmode)) {
			return used;
		}
	} else if (!get_item(&obj, q, s, 0, tval_can_have_charges, itemmode)) {
		return (used);
	}

	i = recharge_failure_chance(obj, strength);
	/* Back-fire */
	if ((i <= 1) || one_in_(i)) {
		struct object *destroyed;
		bool none_left = false;

		msg("The recharge backfires!");
		msg("There is a bright flash of light.");

		/* Reduce and describe inventory */
		if (object_is_carried(player, obj)) {
			destroyed = gear_object_for_use(player, obj, 1, true,
				&none_left);
		} else {
			destroyed = floor_object_for_use(player, obj, 1, true,
				&none_left);
		}
		if (destroyed->known)
			object_delete(player->cave, NULL, &destroyed->known);
		object_delete(cave, player->cave, &destroyed);
	} else {
		/* Extract a "power" */
		int ease_of_recharge = (100 - obj->kind->level) / 10;
		t = (strength / (10 - ease_of_recharge)) + 1;

		/* Recharge based on the power */
		if (t > 0) obj->pval += 2 + randint1(t);
	}

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_INVEN);

	/* Something was done */
	return true;
}